

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void av1_apply_active_map(AV1_COMP *cpi)

{
  void *__dest;
  void *__src;
  int iVar1;
  segmentation *seg_00;
  long in_RDI;
  int num_mis;
  uchar *active_map;
  uchar *seg_map;
  segmentation *seg;
  
  seg_00 = (segmentation *)(in_RDI + 0x409b8);
  __dest = *(void **)(in_RDI + 0x71298);
  __src = *(void **)(in_RDI + 0x712b8);
  iVar1 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
  if ((iVar1 != 0) || (*(int *)(in_RDI + 0x60854) == 0)) {
    *(undefined4 *)(in_RDI + 0x712b0) = 0;
    *(undefined4 *)(in_RDI + 0x712b4) = 1;
  }
  if (*(int *)(in_RDI + 0x712b4) != 0) {
    if (*(int *)(in_RDI + 0x712b0) == 0) {
      av1_disable_segfeature(seg_00,7,'\x06');
      av1_disable_segfeature(seg_00,7,'\x02');
      av1_disable_segfeature(seg_00,7,'\x01');
      av1_disable_segfeature(seg_00,7,'\x03');
      av1_disable_segfeature(seg_00,7,'\x04');
      if (seg_00->enabled != '\0') {
        *(undefined1 *)(in_RDI + 0x409ba) = 1;
        *(undefined1 *)(in_RDI + 0x409b9) = 1;
      }
    }
    else {
      memcpy(__dest,__src,(long)(*(int *)(in_RDI + 0x3c194) * *(int *)(in_RDI + 0x3c198)));
      av1_enable_segmentation(seg_00);
      av1_enable_segfeature(seg_00,7,'\x06');
      av1_enable_segfeature(seg_00,7,'\x02');
      av1_enable_segfeature(seg_00,7,'\x01');
      av1_enable_segfeature(seg_00,7,'\x03');
      av1_enable_segfeature(seg_00,7,'\x04');
      av1_set_segdata(seg_00,7,'\x02',-0x3f);
      av1_set_segdata(seg_00,7,'\x01',-0x3f);
      av1_set_segdata(seg_00,7,'\x03',-0x3f);
      av1_set_segdata(seg_00,7,'\x04',-0x3f);
    }
    *(undefined4 *)(in_RDI + 0x712b4) = 0;
  }
  return;
}

Assistant:

void av1_apply_active_map(AV1_COMP *cpi) {
  struct segmentation *const seg = &cpi->common.seg;
  unsigned char *const seg_map = cpi->enc_seg.map;
  const unsigned char *const active_map = cpi->active_map.map;

  assert(AM_SEGMENT_ID_ACTIVE == CR_SEGMENT_ID_BASE);

  // Disable the active_maps on intra_only frames or if the
  // input map for the current frame has no inactive blocks.
  if (frame_is_intra_only(&cpi->common) ||
      cpi->rc.percent_blocks_inactive == 0) {
    cpi->active_map.enabled = 0;
    cpi->active_map.update = 1;
  }

  if (cpi->active_map.update) {
    if (cpi->active_map.enabled) {
      const int num_mis =
          cpi->common.mi_params.mi_rows * cpi->common.mi_params.mi_cols;
      memcpy(seg_map, active_map, sizeof(active_map[0]) * num_mis);
      av1_enable_segmentation(seg);
      av1_enable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_SKIP);
      av1_enable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_H);
      av1_enable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_V);
      av1_enable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_U);
      av1_enable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_V);

      av1_set_segdata(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_H,
                      -MAX_LOOP_FILTER);
      av1_set_segdata(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_V,
                      -MAX_LOOP_FILTER);
      av1_set_segdata(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_U,
                      -MAX_LOOP_FILTER);
      av1_set_segdata(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_V,
                      -MAX_LOOP_FILTER);
    } else {
      av1_disable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_SKIP);
      av1_disable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_H);
      av1_disable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_V);
      av1_disable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_U);
      av1_disable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_V);
      if (seg->enabled) {
        seg->update_data = 1;
        seg->update_map = 1;
      }
    }
    cpi->active_map.update = 0;
  }
}